

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

DReachabilityPropagator *
dreachable(int r,vec<BoolView> *_vs,vec<BoolView> *_es,vec<vec<int>_> *_in,vec<vec<int>_> *_out,
          vec<vec<int>_> *_en,BoolView b)

{
  DReachabilityPropagatorReif *this;
  BoolView local_40;
  
  this = (DReachabilityPropagatorReif *)operator_new(0x1d8);
  local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
  local_40.v = *(int *)((long)b.super_Var.super_Branching._vptr_Branching + 8);
  local_40.s = *(bool *)((long)b.super_Var.super_Branching._vptr_Branching + 0xc);
  DReachabilityPropagatorReif::DReachabilityPropagatorReif(this,r,_vs,_es,_in,_out,_en,&local_40);
  return &this->super_DReachabilityPropagator;
}

Assistant:

DReachabilityPropagator* dreachable(int r, vec<BoolView>& _vs, vec<BoolView>& _es,
																		vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																		vec<vec<int> >& _en, BoolView b) {
	DReachabilityPropagator* dr =
			new DReachabilityPropagatorReif(r, _vs, _es, _in, _out, _en, std::move(b));
	// if (so.check_prop)
	//     engine.propagators.push(dr);
	return dr;
}